

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O0

void pbrt::InitPBRT(PBRTOptions *opt)

{
  polymorphic_allocator<std::byte> *ppVar1;
  ulong uVar2;
  PBRTOptions *in_RDI;
  PBRTOptions *unaff_retaddr;
  int nThreads;
  char *in_stack_00000048;
  char *in_stack_00000058;
  LogLevel in_stack_00000064;
  Allocator in_stack_00000120;
  Allocator in_stack_00001df0;
  string *in_stack_ffffffffffffffc0;
  
  ppVar1 = (polymorphic_allocator<std::byte> *)operator_new(0xf0);
  PBRTOptions::PBRTOptions(unaff_retaddr,in_RDI);
  Options = ppVar1;
  ppVar1 = Options;
  if (((ulong)Options[1].memoryResource & 0x100) != 0) {
    SuppressErrorMessages();
  }
  InitLogging(Verbose,false);
  if (*(int *)&Options->memoryResource == 0) {
    AvailableCores();
  }
  ParallelInit((int)((ulong)ppVar1 >> 0x20));
  if (((ulong)Options[1].memoryResource & 0x100000000000000) == 0) {
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    Spectra::Init(in_stack_00001df0);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    RGBToSpectrumTable::Init((Allocator)0x771fd1);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    RGBColorSpace::Init(in_stack_00000120);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    InitBufferCaches((Allocator)0x771ff9);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    Triangle::Init((Allocator)0x77200d);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(ppVar1);
    BilinearPatch::Init((Allocator)0x772021);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ConnectToDisplayServer(in_stack_ffffffffffffffc0);
    }
    return;
  }
  LogFatal(in_stack_00000064,in_stack_00000058,opt._4_4_,in_stack_00000048);
}

Assistant:

void InitPBRT(const PBRTOptions &opt) {
    Options = new PBRTOptions(opt);
    // API Initialization

#ifdef PBRT_IS_WINDOWS
    if (Options->useGPU && Options->gpuDevice &&
        getenv("CUDA_VISIBLE_DEVICES") == nullptr) {
        // Limit CUDA to considering only a single GPU on Windows.  pbrt
        // only uses a single GPU anyway, and if there are multiple GPUs
        // plugged in with different architectures, pbrt's use of unified
        // memory causes a performance hit.  We set this early, before CUDA
        // gets going...
        std::string env = StringPrintf("CUDA_VISIBLE_DEVICES=%d", *Options->gpuDevice);
        _putenv(env.c_str());
        // Now CUDA should only see a single device, so tell it that zero
        // is the one to use.
        *Options->gpuDevice = 0;
    }
#endif  // PBRT_IS_WINDOWS

    if (Options->quiet)
        SuppressErrorMessages();

    InitLogging(opt.logLevel, Options->useGPU);

    // General \pbrt Initialization
    int nThreads = Options->nThreads != 0 ? Options->nThreads : AvailableCores();
    ParallelInit(nThreads);  // Threads must be launched before the
                             // profiler is initialized.

    if (Options->useGPU) {
#ifdef PBRT_BUILD_GPU_RENDERER
        GPUInit();

        CUDA_CHECK(cudaMemcpyToSymbol(OptionsGPU, Options, sizeof(OptionsGPU)));

        Spectra::Init(gpuMemoryAllocator);
        RGBToSpectrumTable::Init(gpuMemoryAllocator);

        RGBColorSpace::Init(gpuMemoryAllocator);
        InitBufferCaches(gpuMemoryAllocator);
        Triangle::Init(gpuMemoryAllocator);
        BilinearPatch::Init(gpuMemoryAllocator);
#else
        LOG_FATAL("Options::useGPU set with non-GPU build");
#endif
    } else {
        // Before RGBColorSpace::Init!
        Spectra::Init(Allocator{});
        RGBToSpectrumTable::Init(Allocator{});

        RGBColorSpace::Init(Allocator{});
        InitBufferCaches({});
        Triangle::Init({});
        BilinearPatch::Init({});
    }

    if (!Options->displayServer.empty())
        ConnectToDisplayServer(Options->displayServer);
}